

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indent.cc
# Opt level: O2

void __thiscall libwebm::Indent::Indent(Indent *this,int indent)

{
  this->indent_ = indent;
  (this->indent_str_)._M_dataplus._M_p = (pointer)&(this->indent_str_).field_2;
  (this->indent_str_)._M_string_length = 0;
  (this->indent_str_).field_2._M_local_buf[0] = '\0';
  Update(this);
  return;
}

Assistant:

Indent::Indent(int indent) : indent_(indent), indent_str_() { Update(); }